

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

void __thiscall
cmListFileParser::cmListFileParser
          (cmListFileParser *this,cmListFile *lf,cmMakefile *mf,char *filename)

{
  cmListFileLexer *pcVar1;
  char *filename_local;
  cmMakefile *mf_local;
  cmListFile *lf_local;
  cmListFileParser *this_local;
  
  this->ListFile = lf;
  this->Makefile = mf;
  this->FileName = filename;
  pcVar1 = cmListFileLexer_New();
  this->Lexer = pcVar1;
  cmListFileFunction::cmListFileFunction(&this->Function);
  return;
}

Assistant:

cmListFileParser::cmListFileParser(cmListFile* lf, cmMakefile* mf,
                                   const char* filename):
  ListFile(lf), Makefile(mf), FileName(filename),
  Lexer(cmListFileLexer_New())
{
}